

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O0

TimeZone * icu_63::ZoneMeta::createCustomTimeZone(int32_t offset)

{
  int iVar1;
  SimpleTimeZone *this;
  size_t size;
  SimpleTimeZone *local_88;
  undefined1 local_58 [8];
  UnicodeString zid;
  uint8_t sec;
  uint8_t min;
  uint8_t hour;
  int32_t tmp;
  UBool negative;
  int32_t offset_local;
  
  zid.fUnion._52_4_ = offset;
  if (offset < 0) {
    zid.fUnion._52_4_ = -offset;
  }
  iVar1 = (int)zid.fUnion._52_4_ / 1000;
  zid.fUnion.fStackFields.fBuffer[0x17]._1_1_ =
       (char)iVar1 +
       ((char)(uint)((ulong)((long)iVar1 * 0x88888889) >> 0x25) -
       (char)((long)iVar1 * 0x88888889 >> 0x3f)) * -0x3c;
  zid.fUnion._52_4_ = iVar1 / 0x3c;
  zid.fUnion.fStackFields.fBuffer[0x18]._0_1_ =
       (char)zid.fUnion._52_4_ +
       ((char)(uint)((ulong)((long)(int)zid.fUnion._52_4_ * 0x88888889) >> 0x25) -
       (char)((long)(int)zid.fUnion._52_4_ * 0x88888889 >> 0x3f)) * -0x3c;
  zid.fUnion.fStackFields.fBuffer[0x18]._1_1_ =
       (char)(uint)((ulong)((long)(int)zid.fUnion._52_4_ * 0x88888889) >> 0x25) -
       (char)((long)(int)zid.fUnion._52_4_ * 0x88888889 >> 0x3f);
  UnicodeString::UnicodeString((UnicodeString *)local_58);
  size = (size_t)(byte)zid.fUnion.fStackFields.fBuffer[0x18]._0_1_;
  formatCustomID(zid.fUnion.fStackFields.fBuffer[0x18]._1_1_,
                 zid.fUnion.fStackFields.fBuffer[0x18]._0_1_,
                 zid.fUnion.fStackFields.fBuffer[0x17]._1_1_,offset < 0,(UnicodeString *)local_58);
  this = (SimpleTimeZone *)UMemory::operator_new((UMemory *)0xa0,size);
  local_88 = (SimpleTimeZone *)0x0;
  if (this != (SimpleTimeZone *)0x0) {
    SimpleTimeZone::SimpleTimeZone(this,offset,(UnicodeString *)local_58);
    local_88 = this;
  }
  UnicodeString::~UnicodeString((UnicodeString *)local_58);
  return (TimeZone *)local_88;
}

Assistant:

TimeZone*
ZoneMeta::createCustomTimeZone(int32_t offset) {
    UBool negative = FALSE;
    int32_t tmp = offset;
    if (offset < 0) {
        negative = TRUE;
        tmp = -offset;
    }
    uint8_t hour, min, sec;

    tmp /= 1000;
    sec = static_cast<uint8_t>(tmp % 60);
    tmp /= 60;
    min = static_cast<uint8_t>(tmp % 60);
    hour = static_cast<uint8_t>(tmp / 60);

    UnicodeString zid;
    formatCustomID(hour, min, sec, negative, zid);
    return new SimpleTimeZone(offset, zid);
}